

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::BatchedMatMulLayerParams::_internal_mutable_weights
          (BatchedMatMulLayerParams *this)

{
  Arena *arena;
  WeightParams *pWVar1;
  WeightParams *p;
  BatchedMatMulLayerParams *this_local;
  
  if (this->weights_ == (WeightParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pWVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (arena);
    this->weights_ = pWVar1;
  }
  return this->weights_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* BatchedMatMulLayerParams::_internal_mutable_weights() {
  
  if (weights_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    weights_ = p;
  }
  return weights_;
}